

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O1

Node * FindNode(Node *root,string *name)

{
  size_t __n;
  pointer ppNVar1;
  int iVar2;
  Node *pNVar3;
  pointer ppNVar4;
  
  __n = (root->mName)._M_string_length;
  if ((__n != name->_M_string_length) ||
     ((__n != 0 &&
      (iVar2 = bcmp((root->mName)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n), iVar2 != 0)))) {
    ppNVar1 = (root->mChildren).
              super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppNVar4 = (root->mChildren).
                   super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppNVar4 != ppNVar1;
        ppNVar4 = ppNVar4 + 1) {
      pNVar3 = FindNode(*ppNVar4,name);
      if (pNVar3 != (Node *)0x0) {
        return pNVar3;
      }
    }
    root = (Node *)0x0;
  }
  return root;
}

Assistant:

D3DS::Node* FindNode(D3DS::Node* root, const std::string& name)
{
    if (root->mName == name)
        return root;
    for (std::vector<D3DS::Node*>::iterator it = root->mChildren.begin();it != root->mChildren.end(); ++it) {
        D3DS::Node* nd;
        if (( nd = FindNode(*it,name)))
            return nd;
    }
    return NULL;
}